

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

string * __thiscall
Diligent::FormatString<char[25],unsigned_int,char[17],unsigned_long,char[53]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [25],uint *Args_1,
          char (*Args_2) [17],unsigned_long *Args_3,char (*Args_4) [53])

{
  stringstream local_1c0 [8];
  stringstream ss;
  char (*Args_local_4) [53];
  unsigned_long *Args_local_3;
  char (*Args_local_2) [17];
  uint *Args_local_1;
  char (*Args_local) [25];
  
  std::__cxx11::stringstream::stringstream(local_1c0);
  FormatStrSS<std::__cxx11::stringstream,char[25],unsigned_int,char[17],unsigned_long,char[53]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,
             (char (*) [25])this,(uint *)Args,(char (*) [17])Args_1,(unsigned_long *)Args_2,
             (char (*) [53])Args_3);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1c0);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}